

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringhelpers.h
# Opt level: O1

bool chibi::eat_word_v2(char **line,char **word)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  
  cVar1 = **line;
  pcVar4 = *line;
  while( true ) {
    if (cVar1 == '\0') {
      return false;
    }
    pcVar5 = pcVar4 + 1;
    iVar2 = isspace((int)cVar1);
    if (iVar2 == 0) break;
    *line = pcVar5;
    cVar1 = *pcVar5;
    pcVar4 = pcVar5;
  }
  if (cVar1 == '\0') {
    return false;
  }
  if (cVar1 == '\"') {
    *line = pcVar5;
    *word = pcVar5;
    pcVar4 = *line;
    while( true ) {
      if ((*pcVar4 == '\0') || (*pcVar4 == '\"')) break;
      *line = pcVar4 + 1;
      pcVar4 = pcVar4 + 1;
    }
  }
  else {
    *word = pcVar4;
    pcVar4 = *line;
    cVar1 = *pcVar4;
    while (cVar1 != '\0') {
      pcVar4 = pcVar4 + 1;
      iVar2 = isspace((int)cVar1);
      if (iVar2 != 0) break;
      *line = pcVar4;
      cVar1 = *pcVar4;
    }
  }
  pcVar4 = *line;
  bVar3 = *word < pcVar4;
  if (*word < pcVar4) {
    if (*pcVar4 != '\0') {
      *pcVar4 = '\0';
      *line = *line + 1;
    }
    pcVar4 = *line;
    bVar3 = true;
    cVar1 = *pcVar4;
    while (cVar1 != '\0') {
      pcVar4 = pcVar4 + 1;
      iVar2 = isspace((int)cVar1);
      if (iVar2 == 0) {
        return true;
      }
      *line = pcVar4;
      cVar1 = *pcVar4;
    }
  }
  return bVar3;
}

Assistant:

static bool eat_word_v2(char *& line, const char *& word)
	{
		while (*line != 0 && is_whitespace(*line) == true)
			line++;
		
		if (*line == 0)
			return false;
		
		const bool isQuoted = *line == '"';

		if (isQuoted)
		{
			line++;

			word = line;
			
			while (*line != 0 && *line != '"')
				line++;
		}
		else
		{
			word = line;
			
			while (*line != 0 && is_whitespace(*line) == false)
				line++;
		}
		
		if (line > word)
		{
			// null-terminate the extracted text
			
			if (*line != 0)
			{
				*line = 0;
				line++;
			}

			// make sure to increment the line pointer until we reach non-whitespace territory again

			while (*line != 0 && is_whitespace(*line))
				line++;
			
			return true;
		}
		else
		{
			return false;
		}
	}